

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O3

void negatecondition(FuncState *fs,expdesc *e)

{
  uint *puVar1;
  uint uVar2;
  ulong uVar3;
  
  puVar1 = fs->f->code + (e->u).info;
  if (0 < (long)(e->u).info) {
    uVar2 = puVar1[-1];
    uVar3 = (ulong)(uVar2 & 0xff);
    if ((char)luaP_opmodes[uVar3] < '\0') {
      puVar1 = puVar1 + -1;
      goto LAB_001471c3;
    }
  }
  uVar2 = *puVar1;
  uVar3 = (ulong)(uVar2 & 0xff);
LAB_001471c3:
  if (((uVar2 & 0xfe) != 0x22) && ((char)luaP_opmodes[uVar3] < '\0')) {
    *(bool *)((long)puVar1 + 1) = (uVar2 & 0x7f00) == 0;
    if (((byte)ravi_parser_debug & 2) == 0) {
      return;
    }
    raviY_printf(fs,"[%d]* %o ; set A to %d\n",(ulong)(uint)(e->u).info,(ulong)*puVar1,
                 (ulong)(*puVar1 >> 8 & 0x7f));
    return;
  }
  __assert_fail("(luaP_opmodes[((OpCode)(((*pc)&0xff)))] & (1 << 7)) && ((OpCode)(((*pc)&0xff))) != OP_TESTSET && ((OpCode)(((*pc)&0xff))) != OP_TEST"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lcode.c"
                ,0x456,"void negatecondition(FuncState *, expdesc *)");
}

Assistant:

static void negatecondition (FuncState *fs, expdesc *e) {
  Instruction *pc = getjumpcontrol(fs, e->u.info);
  lua_assert(testTMode(GET_OPCODE(*pc)) && GET_OPCODE(*pc) != OP_TESTSET &&
                                           GET_OPCODE(*pc) != OP_TEST);
  SETARG_A(*pc, !(GETARG_A(*pc)));
  DEBUG_CODEGEN(raviY_printf(fs, "[%d]* %o ; set A to %d\n", e->u.info, *pc, GETARG_A(*pc)));
}